

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float64_eq_quiet_mips64el(float64 a,float64 b,float_status *status)

{
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0) {
      a = a & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
    if ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0) {
      b = b & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
  }
  if (((~a & 0x7ff0000000000000) != 0 || (a & 0xfffffffffffff) == 0) &&
     ((b & 0xfffffffffffff) == 0 || (~b & 0x7ff0000000000000) != 0)) {
    return (int)(((b | a) & 0x7fffffffffffffff) == 0 || a == b);
  }
  if (status->snan_bit_is_one == '\0') {
    if (((a & 0x7ffffffffffff) == 0 || (a & 0x7ff8000000000000) != 0x7ff0000000000000) &&
       ((b & 0x7ffffffffffff) == 0 || (b & 0x7ff8000000000000) != 0x7ff0000000000000)) {
      return 0;
    }
  }
  else if (((uint)(b >> 0x33) & 0xfff) < 0xfff && ((uint)(a >> 0x33) & 0xfff) < 0xfff) {
    return 0;
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return 0;
}

Assistant:

int float64_eq_quiet(float64 a, float64 b, float_status *status)
{
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    av = float64_val(a);
    bv = float64_val(b);
    return ( av == bv ) || ( (uint64_t) ( ( av | bv )<<1 ) == 0 );

}